

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

void Lpk_NodeCutSignature(Lpk_Cut_t *pCut)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  pCut->uSign[0] = 0;
  pCut->uSign[1] = 0;
  uVar2 = *(uint *)pCut;
  uVar4 = 0;
  while( true ) {
    if ((uVar2 & 0x3f) <= uVar4) {
      return;
    }
    uVar3 = pCut->pLeaves[uVar4];
    puVar1 = (uint *)((long)pCut->uSign + (ulong)(uVar3 >> 3 & 4));
    *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
    if (((uVar2 & 0x3f) - 1 != uVar4) && (pCut->pLeaves[uVar4 + 1] <= (int)uVar3)) break;
    uVar4 = uVar4 + 1;
  }
  __assert_fail("pCut->pLeaves[i] < pCut->pLeaves[i+1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                ,0x1cd,"void Lpk_NodeCutSignature(Lpk_Cut_t *)");
}

Assistant:

void Lpk_NodeCutSignature( Lpk_Cut_t * pCut )
{
    unsigned i;
    pCut->uSign[0] = pCut->uSign[1] = 0;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pCut->uSign[(pCut->pLeaves[i] & 32) > 0] |= (1 << (pCut->pLeaves[i] & 31));
        if ( i != pCut->nLeaves - 1 )
            assert( pCut->pLeaves[i] < pCut->pLeaves[i+1] );
    }
}